

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_hello.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  uchar *data;
  
  data = (uchar *)operator_new__(10000);
  memset(data,0,10000);
  iVar1 = libbrain::
          state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)9>
          ::exec(data,0);
  operator_delete__(data);
  return iVar1;
}

Assistant:

int main() {
    // allocate some amount of memory for our program to work with
    auto* data = BRAIN_ALLOC_TAPE(10000);

    // compiles a program which prints "hello world!"
    // thank you KSab https://codegolf.stackexchange.com/questions/55422/hello-world/163590#163590
    BRAIN_PROGRAM hello_bf = BRAIN_COMPILE(+[>>>->-[>->----<<<]>>]>.---.>+..+++.>>.<.>>---.<<<.+++.------.<-.>>+.);

    // run the program
    // identical to `hello_bf.exec(data, 0, stdout, stdin);`
    int status_code = hello_bf.exec(data, 0);

    delete[] data;

    return status_code;
}